

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var4;
  OneofDescriptor *pOVar5;
  bool bVar6;
  FieldGeneratorInfo *pFVar7;
  LogMessage *pLVar8;
  long *plVar9;
  OneofGeneratorInfo *pOVar10;
  _Rb_tree_node_base *p_Var11;
  Descriptor *pDVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  LogMessage local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  int *local_178 [2];
  int local_168 [10];
  char *local_140;
  long local_138;
  char local_130 [32];
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  io::Printer::Print<>(printer,"@java.lang.Override\npublic boolean equals(");
  io::Printer::Print<>(printer,"final java.lang.Object obj) {\n");
  io::Printer::Indent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&local_1d0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
             ,(char (*) [10])0x3f42d2,(string *)&local_1d0);
  if ((char *)local_1d0._0_8_ != (char *)((long)&local_1d0 + 0x10U)) {
    operator_delete((void *)local_1d0._0_8_);
  }
  pDVar12 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar12 + 4)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      lVar2 = *(long *)(pDVar12 + 0x28);
      if ((((*(byte *)(lVar2 + 1 + lVar14) & 0x10) == 0) ||
          (lVar3 = *(long *)(lVar2 + 0x28 + lVar14), lVar3 == 0)) ||
         ((*(int *)(lVar3 + 4) == 1 && ((*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) != 0)))) {
        pFVar7 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar2 + lVar14));
        bVar6 = anon_unknown_27::CheckHasBitsForEqualsAndHashCode
                          ((FieldDescriptor *)(lVar2 + lVar14));
        if (bVar6) {
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,
                     "if (has$name$() != other.has$name$()) return false;\nif (has$name$()) {\n",
                     (char (*) [5])0x3f58c9,&pFVar7->capitalized_name);
          io::Printer::Indent(printer);
          if (*(Descriptor **)(lVar2 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_110,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_110,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1d0,pLVar8);
            internal::LogMessage::~LogMessage(&local_110);
          }
          if ((*(byte *)(lVar2 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar2 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x28 + lVar14);
            if (lVar3 == 0) {
              plVar9 = (long *)(*(long *)(lVar2 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar3 + 0x50);
            }
          }
          _Var4._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar2 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x90))
                    (_Var4._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print<>(printer,"}\n");
        }
        else {
          if (*(Descriptor **)(lVar2 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_d8,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1d0,pLVar8);
            internal::LogMessage::~LogMessage(&local_d8);
          }
          if ((*(byte *)(lVar2 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar2 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x28 + lVar14);
            if (lVar3 == 0) {
              plVar9 = (long *)(*(long *)(lVar2 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar3 + 0x50);
            }
          }
          _Var4._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar2 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x90))
                    (_Var4._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
        }
      }
      lVar13 = lVar13 + 1;
      pDVar12 = (this->super_MessageGenerator).descriptor_;
      lVar14 = lVar14 + 0x48;
    } while (lVar13 < *(int *)(pDVar12 + 4));
  }
  p_Var1 = &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
  for (p_Var11 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header
                 ._M_left; (_Rb_tree_header *)p_Var11 != p_Var1;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    pOVar5 = *(OneofDescriptor **)(p_Var11 + 1);
    pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOVar5);
    io::Printer::Print<char[23],std::__cxx11::string>
              (printer,
               "if (!get$oneof_capitalized_name$Case().equals(other.get$oneof_capitalized_name$Case())) return false;\n"
               ,(char (*) [23])"oneof_capitalized_name",&pOVar10->capitalized_name);
    pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOVar5);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x3fc475,&pOVar10->name);
    io::Printer::Indent(printer);
    if (0 < *(int *)(pOVar5 + 4)) {
      lVar13 = 0;
      lVar14 = 0;
      do {
        lVar2 = *(long *)(pOVar5 + 0x20);
        pcVar15 = (char *)((long)&local_1d0 + 0x10);
        local_1d0._0_8_ = pcVar15;
        local_1d0.filename_ = FastInt32ToBufferLeft(*(int32 *)(lVar2 + 4 + lVar13),pcVar15);
        local_1d0.filename_ = local_1d0.filename_ + -(long)pcVar15;
        local_178[0] = &((LogMessage *)local_178)->line_;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,local_1d0._0_8_,local_1d0.filename_ + local_1d0._0_8_);
        io::Printer::Print<char[13],std::__cxx11::string>
                  (printer,"case $field_number$:\n",(char (*) [13])"field_number",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
        if (local_178[0] != &((LogMessage *)local_178)->line_) {
          operator_delete(local_178[0]);
        }
        io::Printer::Indent(printer);
        if (*(Descriptor **)(lVar2 + 0x20 + lVar13) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          pLVar8 = internal::LogMessage::operator<<
                             (&local_a0,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_1d0,pLVar8);
          internal::LogMessage::~LogMessage(&local_a0);
        }
        if ((*(byte *)(lVar2 + 1 + lVar13) & 8) == 0) {
          plVar9 = (long *)(*(long *)(lVar2 + 0x20 + lVar13) + 0x28);
        }
        else {
          lVar3 = *(long *)(lVar2 + 0x28 + lVar13);
          if (lVar3 == 0) {
            plVar9 = (long *)(*(long *)(lVar2 + 0x10 + lVar13) + 0x70);
          }
          else {
            plVar9 = (long *)(lVar3 + 0x50);
          }
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
        _M_head_impl = (this->field_generators_).field_generators_.
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((lVar2 - *plVar9) + lVar13) >> 3) * 0x38e38e39]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                       ._M_t;
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                              ._M_head_impl + 0x90))
                  (_Var4._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                   ._M_head_impl,printer);
        io::Printer::Print<>(printer,"break;\n");
        io::Printer::Outdent(printer);
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 0x48;
      } while (lVar14 < *(int *)(pOVar5 + 4));
    }
    io::Printer::Print<>(printer,"case 0:\ndefault:\n");
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
  }
  io::Printer::Print<>(printer,"if (!unknownFields.equals(other.unknownFields)) return false;\n");
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x78)) {
    io::Printer::Print<>
              (printer,
               "if (!getExtensionFields().equals(other.getExtensionFields()))\n  return false;\n");
  }
  io::Printer::Print<>(printer,"return true;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>(printer,"@java.lang.Override\npublic int hashCode() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"if (memoizedHashCode != 0) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"return memoizedHashCode;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\nint hash = 41;\n");
  pcVar15 = "hash = (19 * hash) + getDescriptor().hashCode();\n";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x49) != '\0') {
    pcVar15 = "hash = (19 * hash) + getDescriptorForType().hashCode();\n";
  }
  io::Printer::Print<>(printer,pcVar15);
  pDVar12 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar12 + 4)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      lVar2 = *(long *)(pDVar12 + 0x28);
      if ((((*(byte *)(lVar2 + 1 + lVar14) & 0x10) == 0) ||
          (lVar3 = *(long *)(lVar2 + 0x28 + lVar14), lVar3 == 0)) ||
         ((*(int *)(lVar3 + 4) == 1 && ((*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) != 0)))) {
        pFVar7 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar2 + lVar14));
        bVar6 = anon_unknown_27::CheckHasBitsForEqualsAndHashCode
                          ((FieldDescriptor *)(lVar2 + lVar14));
        if (bVar6) {
          io::Printer::Print<char[5],std::__cxx11::string>
                    (printer,"if (has$name$()) {\n",(char (*) [5])0x3f58c9,&pFVar7->capitalized_name
                    );
          io::Printer::Indent(printer);
          if (*(Descriptor **)(lVar2 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_68,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1d0,pLVar8);
            internal::LogMessage::~LogMessage(&local_68);
          }
          if ((*(byte *)(lVar2 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar2 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x28 + lVar14);
            if (lVar3 == 0) {
              plVar9 = (long *)(*(long *)(lVar2 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar3 + 0x50);
            }
          }
          _Var4._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar2 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x98))
                    (_Var4._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print<>(printer,"}\n");
        }
        else {
          if (*(Descriptor **)(lVar2 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_178,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                       ,0x8a);
            pLVar8 = internal::LogMessage::operator<<
                               ((LogMessage *)local_178,
                                "CHECK failed: (field->containing_type()) == (descriptor_): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_1d0,pLVar8);
            internal::LogMessage::~LogMessage((LogMessage *)local_178);
          }
          if ((*(byte *)(lVar2 + 1 + lVar14) & 8) == 0) {
            plVar9 = (long *)(*(long *)(lVar2 + 0x20 + lVar14) + 0x28);
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x28 + lVar14);
            if (lVar3 == 0) {
              plVar9 = (long *)(*(long *)(lVar2 + 0x10 + lVar14) + 0x70);
            }
            else {
              plVar9 = (long *)(lVar3 + 0x50);
            }
          }
          _Var4._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
          ._M_head_impl =
               (this->field_generators_).field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [(int)((ulong)((lVar2 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t;
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                .
                                super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                ._M_head_impl + 0x98))
                    (_Var4._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                     ._M_head_impl,printer);
        }
      }
      lVar13 = lVar13 + 1;
      pDVar12 = (this->super_MessageGenerator).descriptor_;
      lVar14 = lVar14 + 0x48;
    } while (lVar13 < *(int *)(pDVar12 + 4));
  }
  for (p_Var11 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header
                 ._M_left; (_Rb_tree_header *)p_Var11 != p_Var1;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    pOVar5 = *(OneofDescriptor **)(p_Var11 + 1);
    pOVar10 = Context::GetOneofGeneratorInfo(this->context_,pOVar5);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"switch ($oneof_name$Case_) {\n",(char (*) [11])0x3fc475,&pOVar10->name);
    io::Printer::Indent(printer);
    if (0 < *(int *)(pOVar5 + 4)) {
      lVar14 = 0;
      lVar13 = 0;
      do {
        lVar2 = *(long *)(pOVar5 + 0x20);
        local_140 = local_130;
        pcVar15 = FastInt32ToBufferLeft(*(int32 *)(lVar2 + 4 + lVar14),local_130);
        local_138 = (long)pcVar15 - (long)local_130;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,local_140,local_140 + local_138);
        io::Printer::Print<char[13],std::__cxx11::string>
                  (printer,"case $field_number$:\n",(char (*) [13])"field_number",&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        io::Printer::Indent(printer);
        if (*(Descriptor **)(lVar2 + 0x20 + lVar14) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    (&local_1d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          pLVar8 = internal::LogMessage::operator<<
                             (&local_1d0,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar8);
          internal::LogMessage::~LogMessage(&local_1d0);
        }
        if ((*(byte *)(lVar2 + 1 + lVar14) & 8) == 0) {
          plVar9 = (long *)(*(long *)(lVar2 + 0x20 + lVar14) + 0x28);
        }
        else {
          lVar3 = *(long *)(lVar2 + 0x28 + lVar14);
          if (lVar3 == 0) {
            plVar9 = (long *)(*(long *)(lVar2 + 0x10 + lVar14) + 0x70);
          }
          else {
            plVar9 = (long *)(lVar3 + 0x50);
          }
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
        _M_head_impl = (this->field_generators_).field_generators_.
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((lVar2 - *plVar9) + lVar14) >> 3) * 0x38e38e39]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                       ._M_t;
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                              ._M_head_impl + 0x98))
                  (_Var4._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                   ._M_head_impl,printer);
        io::Printer::Print<>(printer,"break;\n");
        io::Printer::Outdent(printer);
        lVar13 = lVar13 + 1;
        lVar14 = lVar14 + 0x48;
      } while (lVar13 < *(int *)(pOVar5 + 4));
    }
    io::Printer::Print<>(printer,"case 0:\ndefault:\n");
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
  }
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x78)) {
    io::Printer::Print<>(printer,"hash = hashFields(hash, getExtensionFields());\n");
  }
  io::Printer::Print<>(printer,"hash = (29 * hash) + unknownFields.hashCode();\n");
  io::Printer::Print<>(printer,"memoizedHashCode = hash;\nreturn hash;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateEqualsAndHashCode(
    io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public boolean equals(");
  printer->Print("final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
      "if (obj == this) {\n"
      " return true;\n"
      "}\n"
      "if (!(obj instanceof $classname$)) {\n"
      "  return super.equals(obj);\n"
      "}\n"
      "$classname$ other = ($classname$) obj;\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
            "if (has$name$() != other.has$name$()) return false;\n"
            "if (has$name$()) {\n",
            "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Compare oneofs.
  for (auto oneof : oneofs_) {
    printer->Print(
        "if (!get$oneof_capitalized_name$Case().equals("
        "other.get$oneof_capitalized_name$Case())) return false;\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // Always consider unknown fields for equality. This will sometimes return
  // false for non-canonical ordering when running in LITE_RUNTIME but it's
  // the best we can do.
  printer->Print(
      "if (!unknownFields.equals(other.unknownFields)) return false;\n");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!getExtensionFields().equals(other.getExtensionFields()))\n"
        "  return false;\n");
  }
  printer->Print("return true;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public int hashCode() {\n");
  printer->Indent();
  printer->Print("if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print("return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!IsRealOneof(field)) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print("if (has$name$()) {\n", "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (auto oneof : oneofs_) {
    printer->Print("switch ($oneof_name$Case_) {\n", "oneof_name",
                   context_->GetOneofGeneratorInfo(oneof)->name);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("case $field_number$:\n", "field_number",
                     StrCat(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
        "case 0:\n"
        "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print("hash = (29 * hash) + unknownFields.hashCode();\n");
  printer->Print(
      "memoizedHashCode = hash;\n"
      "return hash;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");
}